

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_key.c
# Opt level: O0

void DES_set_key_unchecked(const_DES_cblock *key,DES_key_schedule *schedule)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint ret_1;
  uint ret;
  int i;
  DES_LONG *k;
  uchar *in;
  DES_LONG t2;
  DES_LONG s;
  DES_LONG t;
  DES_LONG d;
  DES_LONG c;
  DES_key_schedule *schedule_local;
  const_DES_cblock *key_local;
  
  uVar2 = (*(uint *)(*key + 4) >> 4 ^ *(uint *)*key) & 0xf0f0f0f;
  uVar1 = uVar2 ^ *(uint *)*key;
  uVar2 = uVar2 << 4 ^ *(uint *)(*key + 4);
  uVar3 = (uVar1 << 0x12 ^ uVar1) & 0xcccc0000;
  uVar3 = uVar1 ^ uVar3 ^ uVar3 >> 0x12;
  uVar1 = (uVar2 << 0x12 ^ uVar2) & 0xcccc0000;
  uVar1 = uVar2 ^ uVar1 ^ uVar1 >> 0x12;
  uVar2 = (uVar1 >> 1 ^ uVar3) & 0x55555555;
  uVar3 = uVar2 ^ uVar3;
  uVar1 = uVar2 << 1 ^ uVar1;
  uVar2 = (uVar3 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar2 ^ uVar1;
  uVar3 = uVar2 << 8 ^ uVar3;
  uVar2 = (uVar1 >> 1 ^ uVar3) & 0x55555555;
  uVar3 = uVar2 ^ uVar3;
  uVar1 = uVar2 << 1 ^ uVar1;
  k = (DES_LONG *)schedule;
  d = (uVar1 & 0xff) << 0x10 | uVar1 & 0xff00 | uVar1 >> 0x10 & 0xff |
      (uint)((long)((ulong)uVar3 & 0xf0000000) >> 4);
  c = uVar3 & 0xfffffff;
  for (i = 0; i < 0x10; i = i + 1) {
    if (DES_set_key_unchecked::shifts2[i] == 0) {
      c = c >> 1 | c << 0x1b;
      d = d >> 1 | d << 0x1b;
    }
    else {
      c = c >> 2 | c << 0x1a;
      d = d >> 2 | d << 0x1a;
    }
    uVar2 = c & 0xfffffff;
    uVar1 = d & 0xfffffff;
    uVar3 = des_skb[0][c & 0x3f] | des_skb[1][uVar2 >> 6 & 3 | uVar2 >> 7 & 0x3c] |
            des_skb[2][uVar2 >> 0xd & 0xf | uVar2 >> 0xe & 0x30] |
            des_skb[3][uVar2 >> 0x14 & 1 | uVar2 >> 0x15 & 6 | uVar2 >> 0x16 & 0x38];
    uVar4 = des_skb[4][d & 0x3f] | des_skb[5][uVar1 >> 7 & 3 | uVar1 >> 8 & 0x3c] |
            des_skb[6][uVar1 >> 0xf & 0x3f] | des_skb[7][uVar1 >> 0x15 & 0xf | uVar1 >> 0x16 & 0x30]
    ;
    puVar5 = k + 1;
    *k = (uVar4 << 0x10) >> 0x1e | (uVar4 << 0x10 | uVar3 & 0xffff) << 2;
    k = k + 2;
    *puVar5 = uVar4 >> 0x1a | (uVar3 >> 0x10 | uVar4 & 0xffff0000) << 6;
    d = uVar1;
    c = uVar2;
  }
  return;
}

Assistant:

void DES_set_key_unchecked(const_DES_cblock *key, DES_key_schedule *schedule)
{
    static const int shifts2[16] =
        { 0, 0, 1, 1, 1, 1, 1, 1, 0, 1, 1, 1, 1, 1, 1, 0 };
    register DES_LONG c, d, t, s, t2;
    register const unsigned char *in;
    register DES_LONG *k;
    register int i;

#ifdef OPENBSD_DEV_CRYPTO
    memcpy(schedule->key, key, sizeof(schedule->key));
    schedule->session = NULL;
#endif
    k = &schedule->ks->deslong[0];
    in = &(*key)[0];

    c2l(in, c);
    c2l(in, d);

    /*
     * do PC1 in 47 simple operations. Thanks to John Fletcher
     * for the inspiration.
     */
    PERM_OP(d, c, t, 4, 0x0f0f0f0fL);
    HPERM_OP(c, t, -2, 0xcccc0000L);
    HPERM_OP(d, t, -2, 0xcccc0000L);
    PERM_OP(d, c, t, 1, 0x55555555L);
    PERM_OP(c, d, t, 8, 0x00ff00ffL);
    PERM_OP(d, c, t, 1, 0x55555555L);
    d = (((d & 0x000000ffL) << 16L) | (d & 0x0000ff00L) |
         ((d & 0x00ff0000L) >> 16L) | ((c & 0xf0000000L) >> 4L));
    c &= 0x0fffffffL;

    for (i = 0; i < ITERATIONS; i++) {
        if (shifts2[i]) {
            c = ((c >> 2L) | (c << 26L));
            d = ((d >> 2L) | (d << 26L));
        } else {
            c = ((c >> 1L) | (c << 27L));
            d = ((d >> 1L) | (d << 27L));
        }
        c &= 0x0fffffffL;
        d &= 0x0fffffffL;
        /*
         * could be a few less shifts but I am to lazy at this point in time
         * to investigate
         */
        s = des_skb[0][(c) & 0x3f] |
            des_skb[1][((c >> 6L) & 0x03) | ((c >> 7L) & 0x3c)] |
            des_skb[2][((c >> 13L) & 0x0f) | ((c >> 14L) & 0x30)] |
            des_skb[3][((c >> 20L) & 0x01) | ((c >> 21L) & 0x06) |
                       ((c >> 22L) & 0x38)];
        t = des_skb[4][(d) & 0x3f] |
            des_skb[5][((d >> 7L) & 0x03) | ((d >> 8L) & 0x3c)] |
            des_skb[6][(d >> 15L) & 0x3f] |
            des_skb[7][((d >> 21L) & 0x0f) | ((d >> 22L) & 0x30)];

        /* table contained 0213 4657 */
        t2 = ((t << 16L) | (s & 0x0000ffffL)) & 0xffffffffL;
        *(k++) = ROTATE(t2, 30) & 0xffffffffL;

        t2 = ((s >> 16L) | (t & 0xffff0000L));
        *(k++) = ROTATE(t2, 26) & 0xffffffffL;
    }
}